

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringComparison.h
# Opt level: O2

uint Assimp::ASSIMP_itoa10(char *out,uint max,int32_t number)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  
  if (out == (char *)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                  ,0x53,"unsigned int Assimp::ASSIMP_itoa10(char *, unsigned int, int32_t)");
  }
  if (max < 2 || -1 < number) {
    uVar3 = 1;
  }
  else {
    *out = '-';
    out = out + 1;
    number = -number;
    uVar3 = 2;
  }
  iVar2 = 1000000000;
  bVar1 = 0;
  while (uVar3 < max) {
    bVar5 = (int)((long)number / (long)iVar2) != 0;
    bVar6 = iVar2 == 1;
    pcVar4 = out;
    if ((bool)(bVar1 | bVar6 | bVar5)) {
      pcVar4 = out + 1;
      uVar3 = uVar3 + 1;
      *out = (char)((long)number / (long)iVar2) + '0';
      out = pcVar4;
      number = number % iVar2;
      if (iVar2 == 1) break;
    }
    iVar2 = iVar2 / 10;
    out = pcVar4;
    bVar1 = bVar1 | bVar6 | bVar5;
  }
  *out = '\0';
  return uVar3 - 1;
}

Assistant:

AI_FORCE_INLINE
unsigned int ASSIMP_itoa10( char* out, unsigned int max, int32_t number) {
    ai_assert(NULL != out);

    // write the unary minus to indicate we have a negative number
    unsigned int written = 1u;
    if (number < 0 && written < max)    {
        *out++ = '-';
        ++written;
        number = -number;
    }

    // We begin with the largest number that is not zero.
    int32_t cur = 1000000000; // 2147483648
    bool mustPrint = false;
    while (written < max)   {

        const unsigned int digit = number / cur;
        if (mustPrint || digit > 0 || 1 == cur) {
            // print all future zeroe's from now
            mustPrint = true;

            *out++ = '0'+static_cast<char>(digit);

            ++written;
            number -= digit*cur;
            if (1 == cur) {
                break;
            }
        }
        cur /= 10;
    }

    // append a terminal zero
    *out++ = '\0';
    return written-1;
}